

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::SetLocal(VirtualMachine *this)

{
  element_type *peVar1;
  size_t __n;
  reference pvVar2;
  Variable VVar3;
  string local_68;
  undefined1 local_48 [8];
  shared_ptr<runtime::StackFrame> stackFrame;
  
  if ((this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"No stack frame found in SetLocal",(allocator<char> *)local_48);
    panic(this,&local_68);
  }
  std::__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2> *)local_48,
             &(this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>
            );
  __n = getByteCodeParameter(this);
  if (__n < (ulong)((long)(((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)
                           ((long)local_48 + 8))->
                          super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>)
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)
                           ((long)local_48 + 8))->
                          super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>)
                          ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    VVar3 = popOpStack(this);
    pvVar2 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::at
                       ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)
                        ((long)local_48 + 8),__n);
    pvVar2->type = VVar3.type;
    (pvVar2->field_1).integerValue = (int64_t)VVar3.field_1;
    peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar1->programCounter = peVar1->programCounter + 1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stackFrame);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Index out of bounds in SetLocal",
             (allocator<char> *)
             ((long)&stackFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  panic(this,&local_68);
}

Assistant:

void runtime::VirtualMachine::SetLocal() {
  if (this->stackFrame == nullptr) {
    this->panic("No stack frame found in SetLocal");
    return;
  }

  auto stackFrame = this->stackFrame;

  auto locals = &stackFrame->locals;

  auto index = this->getByteCodeParameter();

  if (index >= locals->size()) {
    this->panic("Index out of bounds in SetLocal");
    return;
  }

  Variable top = this->popOpStack();

  locals->at(index) = top;

  this->advance();
}